

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  undefined8 *puVar2;
  uint *puVar3;
  DataKey *pDVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  undefined8 uVar8;
  DataKey DVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  pointer pnVar15;
  int *piVar16;
  fpclass_type fVar17;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar18;
  int32_t *piVar19;
  DataKey *pDVar20;
  int32_t iVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar22;
  long lVar23;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar24;
  long lVar25;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  long lVar27;
  int *piVar28;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  undefined1 local_2b8 [16];
  DataKey local_2a8;
  uint uStack_2a0;
  undefined3 uStack_29b;
  uint local_298;
  undefined3 uStack_293;
  int local_290;
  bool local_28c;
  undefined8 local_288;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_280;
  cpp_dec_float<50U,_int,_void> local_278;
  int local_23c;
  DataKey local_238;
  DataKey DStack_230;
  DataKey local_228;
  uint uStack_220;
  undefined3 uStack_21b;
  uint local_218;
  uint uStack_214;
  int local_210;
  bool local_20c;
  undefined8 local_208;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f8;
  cpp_dec_float<50U,_int,_void> *local_1f0;
  DataKey local_1e8;
  DataKey DStack_1e0;
  DataKey local_1d8;
  uint uStack_1d0;
  undefined3 uStack_1cb;
  uint local_1c8;
  undefined3 uStack_1c3;
  int local_1c0;
  bool local_1bc;
  undefined8 local_1b8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  undefined4 local_16c;
  cpp_dec_float<50U,_int,_void> local_168;
  pointer local_128;
  pointer local_120;
  Type local_114;
  DataKey *local_110;
  undefined1 local_108 [16];
  DataKey local_f8;
  uint uStack_f0;
  undefined3 uStack_eb;
  uint local_e8;
  undefined3 uStack_e3;
  int local_e0;
  bool local_dc;
  undefined8 local_d8;
  undefined1 local_c8 [16];
  DataKey local_b8;
  uint uStack_b0;
  undefined3 uStack_ab;
  uint local_a8;
  undefined3 uStack_a3;
  int local_a0;
  bool local_9c;
  undefined8 local_98;
  fpclass_type *local_90;
  fpclass_type *local_88;
  pointer local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_278.fpclass = cpp_dec_float_finite;
  local_278.prec_elem = 10;
  local_278.data._M_elems[0] = 0;
  local_278.data._M_elems[1] = 0;
  local_278.data._M_elems[2] = 0;
  local_278.data._M_elems[3] = 0;
  local_278.data._M_elems[4] = 0;
  local_278.data._M_elems[5] = 0;
  local_278.data._M_elems[6] = 0;
  local_278.data._M_elems[7] = 0;
  local_278.data._M_elems[8] = 0;
  local_278.data._M_elems[9] = 0;
  local_278.exp = 0;
  local_278.neg = false;
  local_1b8._0_4_ = cpp_dec_float_finite;
  local_1b8._4_4_ = 10;
  local_1e8.info = 0;
  local_1e8.idx = 0;
  DStack_1e0.info = 0;
  DStack_1e0.idx = 0;
  local_1d8.info = 0;
  local_1d8.idx = 0;
  _uStack_1d0 = 0;
  uStack_1cb = 0;
  _local_1c8 = 0;
  uStack_1c3 = 0;
  local_1c0 = 0;
  local_1bc = false;
  local_98._0_4_ = cpp_dec_float_finite;
  local_98._4_4_ = 10;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = 0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_b8.info = 0;
  local_b8.idx = 0;
  _uStack_b0 = 0;
  uStack_ab = 0;
  _local_a8 = 0;
  uStack_a3 = 0;
  local_a0 = 0;
  local_9c = false;
  local_d8._0_4_ = cpp_dec_float_finite;
  local_d8._4_4_ = 10;
  local_108._0_4_ = 0;
  local_108._4_4_ = 0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_f8.info = 0;
  local_f8.idx = 0;
  _uStack_f0 = 0;
  uStack_eb = 0;
  _local_e8 = 0;
  uStack_e3 = 0;
  local_e0 = 0;
  local_dc = false;
  local_114 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_114 == LEAVE) {
    local_16c = 0;
  }
  else {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_16c = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_1a8.data._M_elems[8] = (uint)uVar5;
  local_1a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar11 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_1a8.data._M_elems[4] = (uint)uVar10;
  local_1a8.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
  local_1a8.data._M_elems[6] = (uint)uVar11;
  local_1a8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
  local_1a8.data._M_elems[0] = (uint)uVar5;
  local_1a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
  local_1a8.data._M_elems[2] = (uint)uVar8;
  local_1a8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
  local_1a8.exp = (maxabs->m_backend).exp;
  local_1a8.neg = (maxabs->m_backend).neg;
  local_1a8.fpclass = (maxabs->m_backend).fpclass;
  local_1a8.prec_elem = (maxabs->m_backend).prec_elem;
  local_88 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_128 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar16 = (update->thedelta).super_IdxSet.idx;
  local_120 = (update->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_168.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_168.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_168.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_168.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_168.exp = (val->m_backend).exp;
  local_168.neg = (val->m_backend).neg;
  local_168.fpclass = (val->m_backend).fpclass;
  local_168.prec_elem = (val->m_backend).prec_elem;
  local_280 = this;
  local_58 = val;
  local_50 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    iVar14 = (update->thedelta).super_IdxSet.num;
    local_23c = -1;
    if (start < iVar14) {
      local_80 = (pointer)(piVar16 + iVar14);
      pcVar26 = (cpp_dec_float<50U,_int,_void> *)(piVar16 + start);
      pnVar1 = &this->epsilon;
      local_68 = *(double *)(in_FS_OFFSET + -8);
      local_1f8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&this->fastDelta;
      uStack_60 = 0;
      local_48 = -local_68;
      uStack_40 = 0x8000000000000000;
      local_110 = (DataKey *)((long)incr << 2);
      local_23c = -1;
      pSVar24 = this;
      do {
        iVar14 = *(int *)pcVar26;
        if (local_114 == LEAVE) {
          pSVar6 = (pSVar24->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (pSVar24->iscoid == true) {
            pDVar18 = (pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar18 = (pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (pSVar6->theRep * pDVar18->data[iVar14] < 1) goto LAB_002b2202;
        }
        else {
LAB_002b2202:
          local_78 = (double)CONCAT44(local_78._4_4_,iVar14);
          if ((char)local_16c != '\0') {
            pSVar6 = (pSVar24->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar7 = (pSVar6->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < pSVar7[iVar14].super_DataKey.info) {
              local_1f0 = pcVar26;
              SPxColId::SPxColId((SPxColId *)local_2b8,pSVar7 + iVar14);
              pcVar26 = local_1f0;
              iVar13 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar6->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)local_2b8);
              pSVar24 = local_280;
              if ((pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar13] == P_FIXED) goto LAB_002b2db4;
            }
          }
          uVar5 = *(undefined8 *)((long)&local_120[iVar14].m_backend.data + 0x20);
          local_278.data._M_elems[8] = (uint)uVar5;
          local_278.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)&local_120[iVar14].m_backend.data;
          uVar8 = *(undefined8 *)((long)&local_120[iVar14].m_backend.data + 8);
          puVar3 = (uint *)((long)&local_120[iVar14].m_backend.data + 0x10);
          uVar10 = *(undefined8 *)puVar3;
          uVar11 = *(undefined8 *)(puVar3 + 2);
          local_278.data._M_elems[4] = (uint)uVar10;
          local_278.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
          local_278.data._M_elems[6] = (uint)uVar11;
          local_278.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
          local_278.data._M_elems[0] = (uint)uVar5;
          local_278.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_278.data._M_elems[2] = (uint)uVar8;
          local_278.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_278.exp = local_120[iVar14].m_backend.exp;
          local_278.neg = local_120[iVar14].m_backend.neg;
          local_278.fpclass = local_120[iVar14].m_backend.fpclass;
          local_278.prec_elem = local_120[iVar14].m_backend.prec_elem;
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          _local_298 = (undefined5)uVar5;
          uStack_293 = (undefined3)((ulong)uVar5 >> 0x28);
          local_2b8 = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
          local_2a8 = *(DataKey *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          _uStack_2a0 = (undefined5)uVar5;
          uStack_29b = (undefined3)((ulong)uVar5 >> 0x28);
          local_290 = (pSVar24->epsilon).m_backend.exp;
          local_28c = (pSVar24->epsilon).m_backend.neg;
          fVar17 = (pSVar24->epsilon).m_backend.fpclass;
          iVar21 = (pSVar24->epsilon).m_backend.prec_elem;
          local_288._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
          local_288._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
          if (fVar17 == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002b23d0:
            auVar12 = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
            local_2a8 = *(DataKey *)((this->epsilon).m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
            _local_298 = (undefined5)uVar5;
            uStack_293 = (undefined3)((ulong)uVar5 >> 0x28);
            _uStack_2a0 = (undefined5)uVar8;
            uStack_29b = (undefined3)((ulong)uVar8 >> 0x28);
            local_288._4_4_ = iVar21;
            local_288._0_4_ = fVar17;
            local_2b8._0_4_ = (undefined4)*(undefined8 *)(pnVar1->m_backend).data._M_elems;
            if (local_2b8._0_4_ != 0 || fVar17 != cpp_dec_float_finite) {
              local_28c = (bool)(local_28c ^ 1);
            }
            local_2b8 = auVar12;
            if (((fVar17 == cpp_dec_float_NaN) || (local_278.fpclass == cpp_dec_float_NaN)) ||
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
               pSVar24 = local_280, -1 < iVar13)) goto LAB_002b2db4;
            local_2b8._4_4_ = local_278.data._M_elems[1];
            local_2b8._0_4_ = local_278.data._M_elems[0];
            local_2b8._12_4_ = local_278.data._M_elems[3];
            local_2b8._8_4_ = local_278.data._M_elems[2];
            local_2a8.idx = local_278.data._M_elems[5];
            local_2a8.info = local_278.data._M_elems[4];
            _local_298 = (undefined5)CONCAT44(local_278.data._M_elems[9],local_278.data._M_elems[8])
            ;
            uStack_293 = (undefined3)(local_278.data._M_elems[9] >> 8);
            _uStack_2a0 = (undefined5)
                          CONCAT44(local_278.data._M_elems[7],local_278.data._M_elems[6]);
            uStack_29b = (undefined3)(local_278.data._M_elems[7] >> 8);
            local_290 = local_278.exp;
            local_28c = local_278.neg;
            local_288._0_4_ = local_278.fpclass;
            local_288._4_4_ = local_278.prec_elem;
            if (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) {
              local_28c = (bool)(local_278.neg ^ 1);
            }
            if (local_1a8.fpclass == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002b2684:
              local_238.idx = local_1a8.data._M_elems[2];
              local_238.info = local_1a8.data._M_elems[1];
              DStack_230.idx = local_1a8.data._M_elems[4];
              DStack_230.info = local_1a8.data._M_elems[3];
              local_228.idx = local_1a8.data._M_elems[6];
              local_228.info = local_1a8.data._M_elems[5];
              _uStack_220 = (undefined5)
                            CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]);
              uStack_21b = (undefined3)(local_1a8.data._M_elems[8] >> 8);
              local_218 = local_1a8.data._M_elems[9];
            }
            else {
              iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_1a8);
              if (iVar13 < 1) {
                goto LAB_002b2684;
              }
              local_238.idx = local_278.data._M_elems[2];
              local_238.info = local_278.data._M_elems[1];
              DStack_230.idx = local_278.data._M_elems[4];
              DStack_230.info = local_278.data._M_elems[3];
              local_228.idx = local_278.data._M_elems[6];
              local_228.info = local_278.data._M_elems[5];
              _uStack_220 = (undefined5)
                            CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
              uStack_21b = (undefined3)(local_278.data._M_elems[8] >> 8);
              local_218 = local_278.data._M_elems[9];
              local_1a8.data._M_elems[0] = 0;
              local_1a8.exp = local_278.exp;
              local_1a8.prec_elem = local_278.prec_elem;
              if (local_278.fpclass == cpp_dec_float_finite && local_278.data._M_elems[0] == 0) {
                local_1a8.fpclass = cpp_dec_float_finite;
                local_1a8.neg = local_278.neg;
              }
              else {
                local_1a8.neg = (bool)(local_278.neg ^ 1);
                local_1a8.fpclass = local_278.fpclass;
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
              }
            }
            local_1a8.data._M_elems[9] = local_218;
            local_1a8.data._M_elems[5] = local_228.info;
            local_1a8.data._M_elems[6] = local_228.idx;
            local_1a8.data._M_elems[7] = (uint)_uStack_220;
            local_1a8.data._M_elems[8] = (uint)(CONCAT35(uStack_21b,_uStack_220) >> 0x20);
            local_1a8.data._M_elems[1] = local_238.info;
            local_1a8.data._M_elems[2] = local_238.idx;
            local_1a8.data._M_elems[3] = DStack_230.info;
            local_1a8.data._M_elems[4] = DStack_230.idx;
            local_108._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data
            ;
            local_108._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data + 8);
            pDVar20 = (DataKey *)
                      ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data +
                      0x10);
            local_f8 = *pDVar20;
            DVar9 = pDVar20[1];
            _uStack_f0 = DVar9._0_5_;
            uStack_eb = DVar9.idx._1_3_;
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data +
                     0x20);
            _local_e8 = (undefined5)uVar5;
            uStack_e3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_e0 = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).exp;
            local_dc = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).neg;
            local_d8._0_4_ = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).fpclass;
            local_d8._4_4_ =
                 (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,local_48);
            pSVar24 = local_280;
            if ((((fpclass_type)local_d8 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_108,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar24 = local_280
               , iVar13 < 1)) goto LAB_002b2db4;
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_2b8 == &local_128[iVar14].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_108);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_e8;
              uStack_293 = uStack_e3;
              local_2a8 = local_f8;
              _uStack_2a0 = _uStack_f0;
              uStack_29b = uStack_eb;
              local_2b8._8_8_ = local_108._8_8_;
              local_2b8._0_8_ = local_108._0_8_;
              local_290 = local_e0;
              local_28c = local_dc;
              local_288._0_4_ = (fpclass_type)local_d8;
              local_288._4_4_ = local_d8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_128[iVar14].m_backend);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar12 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar12;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002b2bfb:
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238.info = 0;
              local_238.idx = 0;
              DStack_230.info = 0;
              DStack_230.idx = 0;
              local_228.info = 0;
              local_228.idx = 0;
              _uStack_220 = 0;
              uStack_21b = 0;
              local_218 = 0;
              uStack_214 = 0;
              local_210 = 0;
              local_20c = false;
              if ((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_238 == local_1f8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_238,
                           (cpp_dec_float<50U,_int,_void> *)&local_1e8);
                if (local_238.info != 0 || (fpclass_type)local_208 != cpp_dec_float_finite) {
                  local_20c = (bool)(local_20c ^ 1);
                }
              }
              else {
                local_218 = (uint)_local_1c8;
                uStack_214 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_228 = local_1d8;
                _uStack_220 = _uStack_1d0;
                uStack_21b = uStack_1cb;
                local_238 = local_1e8;
                DStack_230 = DStack_1e0;
                local_210 = local_1c0;
                local_20c = local_1bc;
                local_208._0_4_ = (fpclass_type)local_1b8;
                local_208._4_4_ = local_1b8._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_238,
                           (cpp_dec_float<50U,_int,_void> *)local_1f8);
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              if (iVar14 < 0) goto LAB_002b2bfb;
              uVar5 = *(undefined8 *)
                       (((array_type *)
                        &local_1f8->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )->_M_elems + 8);
              local_218 = (uint)uVar5;
              uStack_214 = (uint)((ulong)uVar5 >> 0x20);
              local_238.info =
                   *(uint *)&(local_1f8->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              local_238.idx =
                   *(uint *)((long)&(local_1f8->
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4);
              DStack_230 = *(DataKey *)
                            (((array_type *)
                             &local_1f8->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )->_M_elems + 2);
              local_228 = *(DataKey *)
                           (((array_type *)
                            &local_1f8->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )->_M_elems + 4);
              uVar5 = *(undefined8 *)
                       (((array_type *)
                        &local_1f8->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )->_M_elems + 6);
              _uStack_220 = (undefined5)uVar5;
              uStack_21b = (undefined3)((ulong)uVar5 >> 0x28);
              local_210 = (local_280->fastDelta).m_backend.exp;
              local_20c = (local_280->fastDelta).m_backend.neg;
              local_208._0_4_ = (local_280->fastDelta).m_backend.fpclass;
              local_208._4_4_ = (local_280->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_208 != cpp_dec_float_finite || local_238.info != 0) {
                local_20c = (bool)(local_20c ^ 1);
              }
            }
            local_2b8 = ZEXT816(0);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_28c = false;
            local_290 = 0;
            uStack_293 = 0;
            _local_298 = 0;
            uStack_29b = 0;
            _uStack_2a0 = 0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                       (cpp_dec_float<50U,_int,_void> *)&local_238,&local_278);
            local_278.data._M_elems[8] = (uint)_local_298;
            local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
            local_278.data._M_elems[4] = local_2a8.info;
            local_278.data._M_elems[5] = local_2a8.idx;
            local_278.data._M_elems[6] = (uint)_uStack_2a0;
            local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
            local_278.data._M_elems[0] = local_2b8._0_4_;
            local_278.data._M_elems[1] = local_2b8._4_4_;
            local_278.data._M_elems[2] = local_2b8._8_4_;
            local_278.data._M_elems[3] = local_2b8._12_4_;
            local_278.exp = local_290;
            local_278.neg = local_28c;
            local_278.fpclass = (fpclass_type)local_288;
            local_278.prec_elem = local_288._4_4_;
            pSVar24 = local_280;
            if (((fpclass_type)local_288 == cpp_dec_float_NaN) ||
               (local_168.fpclass == cpp_dec_float_NaN)) goto LAB_002b2db4;
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_168);
          }
          else {
            iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
            if (iVar13 < 1) {
              local_290 = (local_280->epsilon).m_backend.exp;
              local_28c = (local_280->epsilon).m_backend.neg;
              fVar17 = (local_280->epsilon).m_backend.fpclass;
              iVar21 = (local_280->epsilon).m_backend.prec_elem;
              pSVar24 = local_280;
              goto LAB_002b23d0;
            }
            piVar19 = &local_1a8.prec_elem;
            fVar17 = local_1a8.fpclass;
            if (local_1a8.fpclass != cpp_dec_float_NaN && local_278.fpclass != cpp_dec_float_NaN) {
              iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_1a8);
              if (iVar13 < 1) {
                piVar19 = &local_1a8.prec_elem;
                fVar17 = local_1a8.fpclass;
              }
              else {
                local_1a8.data._M_elems[8] = local_278.data._M_elems[8];
                local_1a8.data._M_elems[9] = local_278.data._M_elems[9];
                local_1a8.data._M_elems[4] = local_278.data._M_elems[4];
                local_1a8.data._M_elems[5] = local_278.data._M_elems[5];
                local_1a8.data._M_elems[6] = local_278.data._M_elems[6];
                local_1a8.data._M_elems[7] = local_278.data._M_elems[7];
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
                local_1a8.data._M_elems[1] = local_278.data._M_elems[1];
                local_1a8.data._M_elems[2] = local_278.data._M_elems[2];
                local_1a8.data._M_elems[3] = local_278.data._M_elems[3];
                local_1a8.exp = local_278.exp;
                local_1a8.neg = local_278.neg;
                piVar19 = &local_278.prec_elem;
                fVar17 = local_278.fpclass;
              }
            }
            local_1a8.fpclass = fVar17;
            local_1a8.prec_elem = *piVar19;
            local_c8._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data
            ;
            local_c8._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data + 8);
            pDVar20 = (DataKey *)
                      ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data +
                      0x10);
            local_b8 = *pDVar20;
            DVar9 = pDVar20[1];
            _uStack_b0 = DVar9._0_5_;
            uStack_ab = DVar9.idx._1_3_;
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data +
                     0x20);
            _local_a8 = (undefined5)uVar5;
            uStack_a3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_a0 = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).exp;
            local_9c = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).neg;
            local_98._0_4_ = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).fpclass;
            local_98._4_4_ =
                 (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,local_68);
            pSVar24 = local_280;
            if ((((fpclass_type)local_98 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_c8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar24 = local_280
               , -1 < iVar13)) goto LAB_002b2db4;
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_2b8 == &local_128[iVar14].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_c8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_a8;
              uStack_293 = uStack_a3;
              local_2a8 = local_b8;
              _uStack_2a0 = _uStack_b0;
              uStack_29b = uStack_ab;
              local_2b8._8_8_ = local_c8._8_8_;
              local_2b8._0_8_ = local_c8._0_8_;
              local_290 = local_a0;
              local_28c = local_9c;
              local_288._0_4_ = (fpclass_type)local_98;
              local_288._4_4_ = local_98._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_128[iVar14].m_backend);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar12 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar12;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002b295f:
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238.info = 0;
              local_238.idx = 0;
              DStack_230.info = 0;
              DStack_230.idx = 0;
              local_228.info = 0;
              local_228.idx = 0;
              _uStack_220 = 0;
              uStack_21b = 0;
              local_218 = 0;
              uStack_214 = 0;
              local_210 = 0;
              local_20c = false;
              pUVar22 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)&local_1e8;
              if ((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_238 != local_1f8) {
                local_218 = (uint)_local_1c8;
                uStack_214 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_228 = local_1d8;
                _uStack_220 = _uStack_1d0;
                uStack_21b = uStack_1cb;
                local_238 = local_1e8;
                DStack_230 = DStack_1e0;
                local_210 = local_1c0;
                local_20c = local_1bc;
                local_208._0_4_ = (fpclass_type)local_1b8;
                local_208._4_4_ = local_1b8._4_4_;
                pUVar22 = local_1f8;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)&local_238,
                         (cpp_dec_float<50U,_int,_void> *)pUVar22);
              pUVar22 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)&local_238;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              pUVar22 = local_1f8;
              if (0 < iVar14) goto LAB_002b295f;
            }
            local_28c = false;
            local_290 = 0;
            uStack_293 = 0;
            _local_298 = 0;
            uStack_29b = 0;
            _uStack_2a0 = 0;
            local_2b8 = ZEXT816(0);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                       (cpp_dec_float<50U,_int,_void> *)pUVar22,&local_278);
            local_278.data._M_elems[8] = (uint)_local_298;
            local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
            local_278.data._M_elems[4] = local_2a8.info;
            local_278.data._M_elems[5] = local_2a8.idx;
            local_278.data._M_elems[6] = (uint)_uStack_2a0;
            local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
            local_278.data._M_elems[0] = local_2b8._0_4_;
            local_278.data._M_elems[1] = local_2b8._4_4_;
            local_278.data._M_elems[2] = local_2b8._8_4_;
            local_278.data._M_elems[3] = local_2b8._12_4_;
            local_278.exp = local_290;
            local_278.neg = local_28c;
            local_278.fpclass = (fpclass_type)local_288;
            local_278.prec_elem = local_288._4_4_;
            pSVar24 = local_280;
            if (((fpclass_type)local_288 == cpp_dec_float_NaN) ||
               (local_168.fpclass == cpp_dec_float_NaN)) goto LAB_002b2db4;
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_168);
          }
          pSVar24 = local_280;
          if (iVar14 < 0) {
            local_168.data._M_elems[9] = local_278.data._M_elems[9];
            local_168.data._M_elems[8] = local_278.data._M_elems[8];
            local_168.data._M_elems[1] = local_278.data._M_elems[1];
            local_168.data._M_elems[0] = local_278.data._M_elems[0];
            local_168.data._M_elems[3] = local_278.data._M_elems[3];
            local_168.data._M_elems[2] = local_278.data._M_elems[2];
            local_168.data._M_elems[5] = local_278.data._M_elems[5];
            local_168.data._M_elems[4] = local_278.data._M_elems[4];
            local_168.data._M_elems[7] = local_278.data._M_elems[7];
            local_168.data._M_elems[6] = local_278.data._M_elems[6];
            local_23c = local_78._0_4_;
            local_168.exp = local_278.exp;
            local_168.neg = local_278.neg;
            local_168._48_8_ = local_278._48_8_;
          }
        }
LAB_002b2db4:
        pcVar26 = (cpp_dec_float<50U,_int,_void> *)((long)pcVar26 + (long)local_110);
      } while (pcVar26 < local_80);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar23 = (long)((int)((ulong)((long)(update->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_128
                                 ) >> 3) * -0x49249249);
    local_1f8 = update;
    if (lVar23 < 1) {
      local_23c = -1;
      piVar28 = piVar16;
    }
    else {
      local_80 = local_120 + lVar23;
      pDVar20 = (DataKey *)&this->epsilon;
      local_78 = *(double *)(in_FS_OFFSET + -8);
      local_1f0 = &(this->fastDelta).m_backend;
      uStack_70 = 0;
      local_68 = -local_78;
      uStack_60 = 0x8000000000000000;
      local_88 = &(((pointer)local_88)->m_backend).fpclass;
      local_90 = &(((pointer)local_90)->m_backend).fpclass;
      local_23c = -1;
      lVar27 = 0;
      lVar23 = 0;
      lVar25 = 0;
      local_110 = pDVar20;
      do {
        uVar5 = *(undefined8 *)((long)&(local_120->m_backend).data + lVar23 + 0x20);
        local_278.data._M_elems[8] = (uint)uVar5;
        local_278.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        puVar2 = (undefined8 *)((long)&(local_120->m_backend).data + lVar23);
        uVar5 = *puVar2;
        uVar8 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(local_120->m_backend).data + lVar23 + 0x10);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        local_278.data._M_elems[4] = (uint)uVar10;
        local_278.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
        local_278.data._M_elems[6] = (uint)uVar11;
        local_278.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
        local_278.data._M_elems[0] = (uint)uVar5;
        local_278.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_278.data._M_elems[2] = (uint)uVar8;
        local_278.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
        local_278.exp = *(int *)((long)&(local_120->m_backend).data + lVar23 + 0x28);
        local_278.neg = *(bool *)((long)&(local_120->m_backend).data + lVar23 + 0x2c);
        local_278._48_8_ = *(undefined8 *)((long)&(local_120->m_backend).data + lVar23 + 0x30);
        piVar28 = piVar16;
        if (local_278.fpclass == cpp_dec_float_NaN) {
LAB_002b2f26:
          _local_298 = SUB85(pDVar20[4],0);
          uStack_293 = SUB83(pDVar20[4],5);
          auVar12 = *(undefined1 (*) [16])pDVar20;
          local_2a8 = pDVar20[2];
          _uStack_2a0 = SUB85(pDVar20[3],0);
          uStack_29b = SUB83(pDVar20[3],5);
          local_290 = (this->epsilon).m_backend.exp;
          local_28c = (this->epsilon).m_backend.neg;
          local_288._0_4_ = (this->epsilon).m_backend.fpclass;
          local_288._4_4_ = (this->epsilon).m_backend.prec_elem;
          local_2b8._0_4_ = (*pDVar20).info;
          if (local_2b8._0_4_ != 0 || (fpclass_type)local_288 != cpp_dec_float_finite) {
            local_28c = (bool)(local_28c ^ 1);
          }
          local_2b8 = auVar12;
          if ((((fpclass_type)local_288 != cpp_dec_float_NaN) &&
              (local_278.fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
             this = local_280, -1 < iVar14)) {
            local_218 = pDVar20[4].info;
            uStack_214 = pDVar20[4].idx;
            local_238 = *pDVar20;
            DStack_230 = pDVar20[1];
            local_228 = pDVar20[2];
            _uStack_220 = SUB85(pDVar20[3],0);
            uStack_21b = SUB83(pDVar20[3],5);
            local_210 = (local_280->epsilon).m_backend.exp;
            local_20c = (local_280->epsilon).m_backend.neg;
            local_208._0_4_ = (local_280->epsilon).m_backend.fpclass;
            local_208._4_4_ = (local_280->epsilon).m_backend.prec_elem;
            if (((fpclass_type)local_208 != cpp_dec_float_NaN &&
                 local_278.fpclass != cpp_dec_float_NaN) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_278,(cpp_dec_float<50U,_int,_void> *)&local_238),
               this = local_280, iVar14 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)
                         ((long)&(local_120->m_backend).data + lVar23),0.0);
              this = local_280;
              goto LAB_002b3b4a;
            }
          }
          piVar28 = piVar16 + 1;
          *piVar16 = (int)lVar25;
          if (local_114 == LEAVE) {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            if (this->iscoid == true) {
              pDVar18 = (pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.costat;
            }
            else {
              pDVar18 = (pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat;
            }
            if (0 < pSVar6->theRep * pDVar18->data[lVar25]) goto LAB_002b3b4a;
          }
          if ((char)local_16c != '\0') {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar7 = (pSVar6->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar27)) {
              SPxColId::SPxColId((SPxColId *)local_2b8,
                                 (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar27));
              pDVar20 = local_110;
              iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar6->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)local_2b8);
              this = local_280;
              if ((pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_002b3b4a;
            }
          }
          _local_298 = SUB85(pDVar20[4],0);
          uStack_293 = SUB83(pDVar20[4],5);
          local_2b8 = *(undefined1 (*) [16])pDVar20;
          local_2a8 = pDVar20[2];
          _uStack_2a0 = SUB85(pDVar20[3],0);
          uStack_29b = SUB83(pDVar20[3],5);
          local_290 = (this->epsilon).m_backend.exp;
          local_28c = (this->epsilon).m_backend.neg;
          fVar17 = (this->epsilon).m_backend.fpclass;
          iVar21 = (this->epsilon).m_backend.prec_elem;
          local_288._0_4_ = (this->epsilon).m_backend.fpclass;
          local_288._4_4_ = (this->epsilon).m_backend.prec_elem;
          if (fVar17 == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002b31f5:
            local_2a8 = pDVar20[2];
            _local_298 = SUB85(pDVar20[4],0);
            uStack_293 = SUB83(pDVar20[4],5);
            _uStack_2a0 = SUB85(pDVar20[3],0);
            uStack_29b = SUB83(pDVar20[3],5);
            local_288._4_4_ = iVar21;
            local_288._0_4_ = fVar17;
            local_2b8._0_4_ = (*pDVar20).info;
            if (local_2b8._0_4_ != 0 || fVar17 != cpp_dec_float_finite) {
              local_28c = (bool)(local_28c ^ 1);
            }
            if (((fVar17 == cpp_dec_float_NaN) || (local_278.fpclass == cpp_dec_float_NaN)) ||
               (local_2b8 = *(undefined1 (*) [16])pDVar20,
               iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
               this = local_280, -1 < iVar14)) goto LAB_002b3b4a;
            local_2b8._4_4_ = local_278.data._M_elems[1];
            local_2b8._0_4_ = local_278.data._M_elems[0];
            local_2b8._12_4_ = local_278.data._M_elems[3];
            local_2b8._8_4_ = local_278.data._M_elems[2];
            local_2a8.idx = local_278.data._M_elems[5];
            local_2a8.info = local_278.data._M_elems[4];
            _local_298 = (undefined5)CONCAT44(local_278.data._M_elems[9],local_278.data._M_elems[8])
            ;
            uStack_293 = (undefined3)(local_278.data._M_elems[9] >> 8);
            _uStack_2a0 = (undefined5)
                          CONCAT44(local_278.data._M_elems[7],local_278.data._M_elems[6]);
            uStack_29b = (undefined3)(local_278.data._M_elems[7] >> 8);
            local_290 = local_278.exp;
            local_28c = local_278.neg;
            local_288._0_4_ = local_278.fpclass;
            local_288._4_4_ = local_278.prec_elem;
            if (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) {
              local_28c = (bool)(local_278.neg ^ 1);
            }
            if (local_1a8.fpclass == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002b34c4:
              local_238.idx = local_1a8.data._M_elems[2];
              local_238.info = local_1a8.data._M_elems[1];
              DStack_230.idx = local_1a8.data._M_elems[4];
              DStack_230.info = local_1a8.data._M_elems[3];
              local_228.idx = local_1a8.data._M_elems[6];
              local_228.info = local_1a8.data._M_elems[5];
              _uStack_220 = (undefined5)
                            CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]);
              uStack_21b = (undefined3)(local_1a8.data._M_elems[8] >> 8);
              local_218 = local_1a8.data._M_elems[9];
            }
            else {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_1a8);
              if (iVar14 < 1) {
                goto LAB_002b34c4;
              }
              local_238.idx = local_278.data._M_elems[2];
              local_238.info = local_278.data._M_elems[1];
              DStack_230.idx = local_278.data._M_elems[4];
              DStack_230.info = local_278.data._M_elems[3];
              local_228.idx = local_278.data._M_elems[6];
              local_228.info = local_278.data._M_elems[5];
              _uStack_220 = (undefined5)
                            CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
              uStack_21b = (undefined3)(local_278.data._M_elems[8] >> 8);
              local_218 = local_278.data._M_elems[9];
              local_1a8.exp = local_278.exp;
              local_1a8.prec_elem = local_278.prec_elem;
              if (local_278.fpclass == cpp_dec_float_finite && local_278.data._M_elems[0] == 0) {
                local_1a8.fpclass = cpp_dec_float_finite;
                local_1a8.neg = local_278.neg;
                local_1a8.data._M_elems[0] = 0;
              }
              else {
                local_1a8.neg = (bool)(local_278.neg ^ 1);
                local_1a8.fpclass = local_278.fpclass;
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
              }
            }
            local_1a8.data._M_elems[9] = local_218;
            local_1a8.data._M_elems[5] = local_228.info;
            local_1a8.data._M_elems[6] = local_228.idx;
            local_1a8.data._M_elems[7] = (uint)_uStack_220;
            local_1a8.data._M_elems[8] = (uint)(CONCAT35(uStack_21b,_uStack_220) >> 0x20);
            local_1a8.data._M_elems[1] = local_238.info;
            local_1a8.data._M_elems[2] = local_238.idx;
            local_1a8.data._M_elems[3] = DStack_230.info;
            local_1a8.data._M_elems[4] = DStack_230.idx;
            puVar3 = (uint *)((long)local_90 + lVar23 + -0x30);
            local_108._0_8_ = *(undefined8 *)puVar3;
            local_108._8_8_ = *(undefined8 *)(puVar3 + 2);
            pDVar4 = (DataKey *)((long)local_90 + lVar23 + -0x20);
            local_f8 = *pDVar4;
            DVar9 = pDVar4[1];
            _uStack_f0 = DVar9._0_5_;
            uStack_eb = DVar9.idx._1_3_;
            uVar5 = *(undefined8 *)((long)local_90 + lVar23 + -0x10);
            _local_e8 = (undefined5)uVar5;
            uStack_e3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_e0 = *(int *)((long)local_90 + lVar23 + -8);
            local_dc = *(bool *)((long)local_90 + lVar23 + -4);
            local_d8 = *(undefined8 *)((long)local_90 + lVar23);
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,local_68);
            this = local_280;
            if ((((fpclass_type)local_d8 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_108,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), this = local_280,
               iVar14 < 1)) goto LAB_002b3b4a;
            pcVar26 = (cpp_dec_float<50U,_int,_void> *)((long)&local_128->m_backend + lVar23);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if (pcVar26 == (cpp_dec_float<50U,_int,_void> *)local_2b8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_108);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_e8;
              uStack_293 = uStack_e3;
              local_2a8 = local_f8;
              _uStack_2a0 = _uStack_f0;
              uStack_29b = uStack_eb;
              local_2b8._8_8_ = local_108._8_8_;
              local_2b8._0_8_ = local_108._0_8_;
              local_290 = local_e0;
              local_28c = local_dc;
              local_288._0_4_ = (fpclass_type)local_d8;
              local_288._4_4_ = local_d8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar26);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar12 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar12;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              if (-1 < iVar14) {
                uVar5 = *(undefined8 *)((local_1f0->data)._M_elems + 8);
                local_218 = (uint)uVar5;
                uStack_214 = (uint)((ulong)uVar5 >> 0x20);
                local_238.info = (local_1f0->data)._M_elems[0];
                local_238.idx = (local_1f0->data)._M_elems[1];
                DStack_230 = *(DataKey *)((local_1f0->data)._M_elems + 2);
                local_228 = *(DataKey *)((local_1f0->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((local_1f0->data)._M_elems + 6);
                _uStack_220 = (undefined5)uVar5;
                uStack_21b = (undefined3)((ulong)uVar5 >> 0x28);
                local_210 = (local_280->fastDelta).m_backend.exp;
                local_20c = (local_280->fastDelta).m_backend.neg;
                local_208._0_4_ = (local_280->fastDelta).m_backend.fpclass;
                local_208._4_4_ = (local_280->fastDelta).m_backend.prec_elem;
                if ((fpclass_type)local_208 != cpp_dec_float_finite || local_238.info != 0) {
                  local_20c = (bool)(local_20c ^ 1);
                }
                pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_238;
                goto LAB_002b3a7b;
              }
            }
            local_208._0_4_ = cpp_dec_float_finite;
            local_208._4_4_ = 10;
            local_238.info = 0;
            local_238.idx = 0;
            DStack_230.info = 0;
            DStack_230.idx = 0;
            local_228.info = 0;
            local_228.idx = 0;
            _uStack_220 = 0;
            uStack_21b = 0;
            local_218 = 0;
            uStack_214 = 0;
            local_210 = 0;
            local_20c = false;
            if ((cpp_dec_float<50U,_int,_void> *)&local_238 == local_1f0) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)&local_238,
                         (cpp_dec_float<50U,_int,_void> *)&local_1e8);
              if (local_238.info != 0 || (fpclass_type)local_208 != cpp_dec_float_finite) {
                local_20c = (bool)(local_20c ^ 1);
              }
            }
            else {
              local_218 = (uint)_local_1c8;
              uStack_214 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
              local_228 = local_1d8;
              _uStack_220 = _uStack_1d0;
              uStack_21b = uStack_1cb;
              local_238 = local_1e8;
              DStack_230 = DStack_1e0;
              local_210 = local_1c0;
              local_20c = local_1bc;
              local_208._0_4_ = (fpclass_type)local_1b8;
              local_208._4_4_ = local_1b8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)&local_238,local_1f0);
            }
LAB_002b3a55:
            pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_238;
          }
          else {
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
            if (iVar14 < 1) {
              local_290 = (local_280->epsilon).m_backend.exp;
              local_28c = (local_280->epsilon).m_backend.neg;
              fVar17 = (local_280->epsilon).m_backend.fpclass;
              iVar21 = (local_280->epsilon).m_backend.prec_elem;
              this = local_280;
              goto LAB_002b31f5;
            }
            piVar19 = &local_1a8.prec_elem;
            fVar17 = local_1a8.fpclass;
            if (local_1a8.fpclass != cpp_dec_float_NaN && local_278.fpclass != cpp_dec_float_NaN) {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_1a8);
              if (iVar14 < 1) {
                piVar19 = &local_1a8.prec_elem;
                fVar17 = local_1a8.fpclass;
              }
              else {
                local_1a8.data._M_elems[8] = local_278.data._M_elems[8];
                local_1a8.data._M_elems[9] = local_278.data._M_elems[9];
                local_1a8.data._M_elems[4] = local_278.data._M_elems[4];
                local_1a8.data._M_elems[5] = local_278.data._M_elems[5];
                local_1a8.data._M_elems[6] = local_278.data._M_elems[6];
                local_1a8.data._M_elems[7] = local_278.data._M_elems[7];
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
                local_1a8.data._M_elems[1] = local_278.data._M_elems[1];
                local_1a8.data._M_elems[2] = local_278.data._M_elems[2];
                local_1a8.data._M_elems[3] = local_278.data._M_elems[3];
                local_1a8.exp = local_278.exp;
                local_1a8.neg = local_278.neg;
                piVar19 = &local_278.prec_elem;
                fVar17 = local_278.fpclass;
              }
            }
            local_1a8.fpclass = fVar17;
            local_1a8.prec_elem = *piVar19;
            puVar3 = (uint *)((long)local_88 + lVar23 + -0x30);
            local_c8._0_8_ = *(undefined8 *)puVar3;
            local_c8._8_8_ = *(undefined8 *)(puVar3 + 2);
            pDVar4 = (DataKey *)((long)local_88 + lVar23 + -0x20);
            local_b8 = *pDVar4;
            DVar9 = pDVar4[1];
            _uStack_b0 = DVar9._0_5_;
            uStack_ab = DVar9.idx._1_3_;
            uVar5 = *(undefined8 *)((long)local_88 + lVar23 + -0x10);
            _local_a8 = (undefined5)uVar5;
            uStack_a3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_a0 = *(int *)((long)local_88 + lVar23 + -8);
            local_9c = *(bool *)((long)local_88 + lVar23 + -4);
            local_98 = *(undefined8 *)((long)local_88 + lVar23);
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,local_78);
            this = local_280;
            if ((((fpclass_type)local_98 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_c8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), this = local_280,
               -1 < iVar14)) goto LAB_002b3b4a;
            pcVar26 = (cpp_dec_float<50U,_int,_void> *)((long)&local_128->m_backend + lVar23);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if (pcVar26 == (cpp_dec_float<50U,_int,_void> *)local_2b8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_c8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_a8;
              uStack_293 = uStack_a3;
              local_2a8 = local_b8;
              _uStack_2a0 = _uStack_b0;
              uStack_29b = uStack_ab;
              local_2b8._8_8_ = local_c8._8_8_;
              local_2b8._0_8_ = local_c8._0_8_;
              local_290 = local_a0;
              local_28c = local_9c;
              local_288._0_4_ = (fpclass_type)local_98;
              local_288._4_4_ = local_98._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar26);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar12 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar12;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002b3793:
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238.info = 0;
              local_238.idx = 0;
              DStack_230.info = 0;
              DStack_230.idx = 0;
              local_228.info = 0;
              local_228.idx = 0;
              _uStack_220 = 0;
              uStack_21b = 0;
              local_218 = 0;
              uStack_214 = 0;
              local_210 = 0;
              local_20c = false;
              pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_1e8;
              if ((cpp_dec_float<50U,_int,_void> *)&local_238 != local_1f0) {
                local_218 = (uint)_local_1c8;
                uStack_214 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_228 = local_1d8;
                _uStack_220 = _uStack_1d0;
                uStack_21b = uStack_1cb;
                local_238 = local_1e8;
                DStack_230 = DStack_1e0;
                local_210 = local_1c0;
                local_20c = local_1bc;
                local_208._0_4_ = (fpclass_type)local_1b8;
                local_208._4_4_ = local_1b8._4_4_;
                pcVar26 = local_1f0;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)&local_238,pcVar26);
              goto LAB_002b3a55;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                (cpp_dec_float<50U,_int,_void> *)local_2b8);
            pcVar26 = local_1f0;
            if (0 < iVar14) goto LAB_002b3793;
          }
LAB_002b3a7b:
          local_2b8 = ZEXT816(0);
          local_288._0_4_ = cpp_dec_float_finite;
          local_288._4_4_ = 10;
          local_28c = false;
          local_290 = 0;
          uStack_293 = 0;
          _local_298 = 0;
          uStack_29b = 0;
          _uStack_2a0 = 0;
          local_2a8.info = 0;
          local_2a8.idx = 0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar26,&local_278);
          local_278.data._M_elems[8] = (uint)_local_298;
          local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
          local_278.data._M_elems[4] = local_2a8.info;
          local_278.data._M_elems[5] = local_2a8.idx;
          local_278.data._M_elems[6] = (uint)_uStack_2a0;
          local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
          local_278.data._M_elems[0] = local_2b8._0_4_;
          local_278.data._M_elems[1] = local_2b8._4_4_;
          local_278.data._M_elems[2] = local_2b8._8_4_;
          local_278.data._M_elems[3] = local_2b8._12_4_;
          local_278.exp = local_290;
          local_278.neg = local_28c;
          local_278.fpclass = (fpclass_type)local_288;
          local_278.prec_elem = local_288._4_4_;
          this = local_280;
          if ((((fpclass_type)local_288 != cpp_dec_float_NaN) &&
              (local_168.fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_168), this = local_280, iVar14 < 0)) {
            local_168.data._M_elems[9] = local_278.data._M_elems[9];
            local_168.data._M_elems[8] = local_278.data._M_elems[8];
            local_168.data._M_elems[1] = local_278.data._M_elems[1];
            local_168.data._M_elems[0] = local_278.data._M_elems[0];
            local_168.data._M_elems[3] = local_278.data._M_elems[3];
            local_168.data._M_elems[2] = local_278.data._M_elems[2];
            local_168.data._M_elems[5] = local_278.data._M_elems[5];
            local_168.data._M_elems[4] = local_278.data._M_elems[4];
            local_168.data._M_elems[7] = local_278.data._M_elems[7];
            local_168.data._M_elems[6] = local_278.data._M_elems[6];
            local_168.exp = local_278.exp;
            local_168.neg = local_278.neg;
            local_168.fpclass = local_278.fpclass;
            local_168.prec_elem = local_278.prec_elem;
            local_23c = (int)lVar25;
          }
        }
        else {
          local_288._0_4_ = cpp_dec_float_finite;
          local_288._4_4_ = 10;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8.info = 0;
          local_2a8.idx = 0;
          _uStack_2a0 = 0;
          uStack_29b = 0;
          _local_298 = 0;
          uStack_293 = 0;
          local_290 = 0;
          local_28c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_2b8,0.0);
          pDVar20 = local_110;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
          this = local_280;
          if (iVar14 != 0) goto LAB_002b2f26;
        }
LAB_002b3b4a:
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 8;
        pnVar15 = (pointer)((long)&local_120[1].m_backend.data + lVar23);
        lVar23 = lVar23 + 0x38;
        piVar16 = piVar28;
      } while (pnVar15 < local_80);
      piVar16 = (local_1f8->thedelta).super_IdxSet.idx;
    }
    (local_1f8->thedelta).super_IdxSet.num = (int)((ulong)((long)piVar28 - (long)piVar16) >> 2);
    (local_1f8->thedelta).setupStatus = true;
  }
  *(undefined8 *)((local_58->m_backend).data._M_elems + 8) = local_168.data._M_elems._32_8_;
  *(undefined8 *)((local_58->m_backend).data._M_elems + 4) = local_168.data._M_elems._16_8_;
  *(undefined8 *)((local_58->m_backend).data._M_elems + 6) = local_168.data._M_elems._24_8_;
  *(undefined8 *)(local_58->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
  *(undefined8 *)((local_58->m_backend).data._M_elems + 2) = local_168.data._M_elems._8_8_;
  (local_58->m_backend).exp = local_168.exp;
  (local_58->m_backend).neg = local_168.neg;
  (local_58->m_backend).fpclass = local_168.fpclass;
  (local_58->m_backend).prec_elem = local_168.prec_elem;
  *(ulong *)((local_50->m_backend).data._M_elems + 8) =
       CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]);
  *(ulong *)((local_50->m_backend).data._M_elems + 4) =
       CONCAT44(local_1a8.data._M_elems[5],local_1a8.data._M_elems[4]);
  *(ulong *)((local_50->m_backend).data._M_elems + 6) =
       CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]);
  *(ulong *)(local_50->m_backend).data._M_elems =
       CONCAT44(local_1a8.data._M_elems[1],local_1a8.data._M_elems[0]);
  *(ulong *)((local_50->m_backend).data._M_elems + 2) =
       CONCAT44(local_1a8.data._M_elems[3],local_1a8.data._M_elems[2]);
  (local_50->m_backend).exp = local_1a8.exp;
  (local_50->m_backend).neg = local_1a8.neg;
  (local_50->m_backend).fpclass = local_1a8.fpclass;
  (local_50->m_backend).prec_elem = local_1a8.prec_elem;
  return local_23c;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}